

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree_impl.hpp
# Opt level: O0

void __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::IntermediateNode::
loadChildren(IntermediateNode *this,NodeIterator *children)

{
  Node *pNVar1;
  bool bVar2;
  Node **ppNVar3;
  undefined8 *puVar4;
  long *in_RDI;
  Top TVar5;
  Node **own;
  Node *ext;
  Node *in_stack_ffffffffffffffb0;
  
  while( true ) {
    bVar2 = Lib::
            VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Node_**>
            ::hasNext((VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Node_**>
                       *)0x3e5427);
    if (!bVar2) break;
    ppNVar3 = Lib::
              VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Node_**>
              ::next((VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Node_**>
                      *)0x3e5437);
    pNVar1 = *ppNVar3;
    TVar5 = SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Node::top
                      (in_stack_ffffffffffffffb0);
    in_stack_ffffffffffffffb0 = TVar5._inner._inner._0_8_;
    puVar4 = (undefined8 *)
             (**(code **)(*in_RDI + 0x50))
                       (in_RDI,in_stack_ffffffffffffffb0,TVar5._inner._inner._content[7],1);
    *puVar4 = pNVar1;
  }
  return;
}

Assistant:

void SubstitutionTree<LeafData_>::IntermediateNode::loadChildren(NodeIterator children)
{
  while(children.hasNext()) {
    Node* ext=*children.next();
    Node** own=childByTop(ext->top(), true);
    ASS(! *own);
    *own=ext;
  }
}